

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

int CmdCommandUndo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    if ((((*pcVar1 == '-') && (pcVar1[1] == 'h')) && (pcVar1[2] == '\0')) ||
       (pAbc->pNtkCur != (Abc_Ntk_t *)0x0)) {
LAB_00882e58:
      fwrite("usage: undo\n",0xc,1,(FILE *)pAbc->Err);
      fwrite("         sets the current network to be the previously saved network\n",0x45,1,
             (FILE *)pAbc->Err);
      return 1;
    }
  }
  else if (pAbc->pNtkCur != (Abc_Ntk_t *)0x0) {
    if (argc == 1) {
      iVar2 = CmdCommandRecall(pAbc,1,argv);
      return iVar2;
    }
    goto LAB_00882e58;
  }
  fwrite("Empty network.\n",0xf,1,(FILE *)pAbc->Out);
  return 0;
}

Assistant:

int CmdCommandUndo( Abc_Frame_t * pAbc, int argc, char **argv )
{
    if ( argc == 2 && !strcmp(argv[1], "-h") )
        goto usage;

    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }

    // if there are no arguments on the command line
    // set the current network to be the network from the previous step
    if ( argc == 1 )
        return CmdCommandRecall( pAbc, argc, argv );

usage:
    fprintf( pAbc->Err, "usage: undo\n" );
    fprintf( pAbc->Err, "         sets the current network to be the previously saved network\n" );
    return 1;

}